

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O1

bool __thiscall CConnman::DisconnectNode(CConnman *this,string *strNode)

{
  bool bVar1;
  CNode *pCVar2;
  Logger *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RCX;
  long in_FS_OFFSET;
  string_view source_file;
  string_view logging_function;
  NodeId local_50;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock93;
  string local_38;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  criticalblock93.super_unique_lock._M_device = &(this->m_nodes_mutex).super_recursive_mutex;
  criticalblock93.super_unique_lock._M_owns = false;
  std::unique_lock<std::recursive_mutex>::lock(&criticalblock93.super_unique_lock);
  pCVar2 = FindNode(this,strNode);
  if (pCVar2 != (CNode *)0x0) {
    this_00 = LogInstance();
    bVar1 = BCLog::Logger::WillLogCategoryLevel(this_00,NET,Debug);
    if (bVar1) {
      if (fLogIPs == true) {
        tinyformat::format<std::__cxx11::string>
                  (&local_38,(tinyformat *)0xf91d06,(char *)strNode,in_RCX);
      }
      else {
        local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"");
      }
      local_50 = pCVar2->id;
      source_file._M_str =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net.cpp"
      ;
      source_file._M_len = 0x57;
      logging_function._M_str = "DisconnectNode";
      logging_function._M_len = 0xe;
      LogPrintFormatInternal<std::__cxx11::string,long>
                (logging_function,source_file,0xe18,NET,Debug,(ConstevalFormatString<2U>)0xf9c62b,
                 &local_38,&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_38._M_dataplus._M_p != &local_38.field_2) {
        operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
      }
    }
    LOCK();
    (pCVar2->fDisconnect)._M_base._M_i = true;
    UNLOCK();
  }
  std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock93.super_unique_lock);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return pCVar2 != (CNode *)0x0;
  }
  __stack_chk_fail();
}

Assistant:

bool CConnman::DisconnectNode(const std::string& strNode)
{
    LOCK(m_nodes_mutex);
    if (CNode* pnode = FindNode(strNode)) {
        LogDebug(BCLog::NET, "disconnect by address%s matched peer=%d; disconnecting\n", (fLogIPs ? strprintf("=%s", strNode) : ""), pnode->GetId());
        pnode->fDisconnect = true;
        return true;
    }
    return false;
}